

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_52317d::X509Test_NameEntry_Test::TestBody(X509Test_NameEntry_Test *this)

{
  bool bVar1;
  pointer pXVar2;
  char *pcVar3;
  X509_NAME_ENTRY *pXVar4;
  char *in_R9;
  string local_2b8;
  AssertHelper local_298;
  Message local_290;
  int local_284;
  undefined1 local_280 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_250;
  Message local_248;
  int local_23c;
  undefined1 local_238 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_208;
  Message local_200;
  int local_1f4;
  undefined1 local_1f0 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_1c0;
  Message local_1b8;
  int local_1ac;
  undefined1 local_1a8 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_178;
  Message local_170;
  int local_164;
  undefined1 local_160 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_130;
  Message local_128;
  int local_11c;
  undefined1 local_118 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_e8;
  Message local_e0;
  int local_d4;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_a0;
  Message local_98;
  int local_8c;
  undefined1 local_88 [8];
  AssertionResult gtest_ar__1;
  anon_class_8_1_898f2789 check_name;
  string local_68;
  AssertHelper local_48;
  Message local_40 [3];
  undefined1 local_28 [8];
  AssertionResult gtest_ar_;
  UniquePtr<X509_NAME> name;
  X509Test_NameEntry_Test *this_local;
  
  pXVar2 = (pointer)X509_NAME_new();
  std::unique_ptr<X509_name_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<X509_name_st,bssl::internal::Deleter> *)&gtest_ar_.message_,pXVar2);
  testing::AssertionResult::AssertionResult<std::unique_ptr<X509_name_st,bssl::internal::Deleter>>
            ((AssertionResult *)local_28,
             (unique_ptr<X509_name_st,_bssl::internal::Deleter> *)&gtest_ar_.message_,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,(internal *)local_28,(AssertionResult *)0x82fd02,"false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
               ,0x1633,pcVar3);
    testing::internal::AssertHelper::operator=(&local_48,local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    testing::Message::~Message(local_40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  if (bVar1) {
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )&gtest_ar_.message_;
    TestBody::anon_class_8_1_898f2789::operator()
              ((anon_class_8_1_898f2789 *)&gtest_ar__1.message_,"");
    pXVar2 = std::unique_ptr<X509_name_st,_bssl::internal::Deleter>::get
                       ((unique_ptr<X509_name_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
    pcVar3 = (char *)0xffffffff;
    local_8c = X509_NAME_add_entry_by_NID((X509_NAME *)pXVar2,0x11,0x1000,"Org",-1,-1,0);
    testing::AssertionResult::AssertionResult<int>
              ((AssertionResult *)local_88,&local_8c,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
    if (!bVar1) {
      testing::Message::Message(&local_98);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__2.message_,(internal *)local_88,
                 (AssertionResult *)
                 "X509_NAME_add_entry_by_NID( name.get(), 17, (0x1000), reinterpret_cast<const unsigned char *>(\"Org\"), -1, -1, 0)"
                 ,"false","true",pcVar3);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_a0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0x1656,pcVar3);
      testing::internal::AssertHelper::operator=(&local_a0,&local_98);
      testing::internal::AssertHelper::~AssertHelper(&local_a0);
      std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
      testing::Message::~Message(&local_98);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
    if (bVar1) {
      TestBody::anon_class_8_1_898f2789::operator()
                ((anon_class_8_1_898f2789 *)&gtest_ar__1.message_,"O=Org");
      pXVar2 = std::unique_ptr<X509_name_st,_bssl::internal::Deleter>::get
                         ((unique_ptr<X509_name_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
      pcVar3 = (char *)0xffffffff;
      local_d4 = X509_NAME_add_entry_by_NID((X509_NAME *)pXVar2,0xd,0x1000,"Name",-1,-1,0);
      testing::AssertionResult::AssertionResult<int>
                ((AssertionResult *)local_d0,&local_d4,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
      if (!bVar1) {
        testing::Message::Message(&local_e0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__3.message_,(internal *)local_d0,
                   (AssertionResult *)
                   "X509_NAME_add_entry_by_NID( name.get(), 13, (0x1000), reinterpret_cast<const unsigned char *>(\"Name\"), -1, -1, 0)"
                   ,"false","true",pcVar3);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_e8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                   ,0x165d,pcVar3);
        testing::internal::AssertHelper::operator=(&local_e8,&local_e0);
        testing::internal::AssertHelper::~AssertHelper(&local_e8);
        std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
        testing::Message::~Message(&local_e0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
      if (bVar1) {
        TestBody::anon_class_8_1_898f2789::operator()
                  ((anon_class_8_1_898f2789 *)&gtest_ar__1.message_,"CN=Name,O=Org");
        pXVar2 = std::unique_ptr<X509_name_st,_bssl::internal::Deleter>::get
                           ((unique_ptr<X509_name_st,_bssl::internal::Deleter> *)&gtest_ar_.message_
                           );
        pcVar3 = (char *)0x1;
        local_11c = X509_NAME_add_entry_by_NID
                              ((X509_NAME *)pXVar2,0x12,0x1000,(uchar *)"Unit",-1,1,0);
        testing::AssertionResult::AssertionResult<int>
                  ((AssertionResult *)local_118,&local_11c,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
        if (!bVar1) {
          testing::Message::Message(&local_128);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar__4.message_,(internal *)local_118,
                     (AssertionResult *)
                     "X509_NAME_add_entry_by_NID( name.get(), 18, (0x1000), reinterpret_cast<const unsigned char *>(\"Unit\"), -1, 1, 0)"
                     ,"false","true",pcVar3);
          pcVar3 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_130,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                     ,0x1665,pcVar3);
          testing::internal::AssertHelper::operator=(&local_130,&local_128);
          testing::internal::AssertHelper::~AssertHelper(&local_130);
          std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
          testing::Message::~Message(&local_128);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
        if (bVar1) {
          TestBody::anon_class_8_1_898f2789::operator()
                    ((anon_class_8_1_898f2789 *)&gtest_ar__1.message_,"CN=Name,OU=Unit,O=Org");
          pXVar2 = std::unique_ptr<X509_name_st,_bssl::internal::Deleter>::get
                             ((unique_ptr<X509_name_st,_bssl::internal::Deleter> *)
                              &gtest_ar_.message_);
          pcVar3 = (char *)0x2;
          local_164 = X509_NAME_add_entry_by_NID
                                ((X509_NAME *)pXVar2,0x11,0x1000,(uchar *)"Org2",-1,2,-1);
          testing::AssertionResult::AssertionResult<int>
                    ((AssertionResult *)local_160,&local_164,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
          if (!bVar1) {
            testing::Message::Message(&local_170);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar__5.message_,(internal *)local_160,
                       (AssertionResult *)
                       "X509_NAME_add_entry_by_NID( name.get(), 17, (0x1000), reinterpret_cast<const unsigned char *>(\"Org2\"), -1, 2, -1)"
                       ,"false","true",pcVar3);
            pcVar3 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_178,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                       ,0x166e,pcVar3);
            testing::internal::AssertHelper::operator=(&local_178,&local_170);
            testing::internal::AssertHelper::~AssertHelper(&local_178);
            std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
            testing::Message::~Message(&local_170);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
          if (bVar1) {
            TestBody::anon_class_8_1_898f2789::operator()
                      ((anon_class_8_1_898f2789 *)&gtest_ar__1.message_,
                       "CN=Name,O=Org2+OU=Unit,O=Org");
            pXVar2 = std::unique_ptr<X509_name_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<X509_name_st,_bssl::internal::Deleter> *)
                                &gtest_ar_.message_);
            pcVar3 = (char *)0x2;
            local_1ac = X509_NAME_add_entry_by_NID
                                  ((X509_NAME *)pXVar2,0xd,0x1000,(uchar *)"Name2",-1,2,-1);
            testing::AssertionResult::AssertionResult<int>
                      ((AssertionResult *)local_1a8,&local_1ac,(type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a8);
            if (!bVar1) {
              testing::Message::Message(&local_1b8);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar__6.message_,(internal *)local_1a8,
                         (AssertionResult *)
                         "X509_NAME_add_entry_by_NID( name.get(), 13, (0x1000), reinterpret_cast<const unsigned char *>(\"Name2\"), -1, 2, -1)"
                         ,"false","true",pcVar3);
              pcVar3 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_1c0,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                         ,0x1675,pcVar3);
              testing::internal::AssertHelper::operator=(&local_1c0,&local_1b8);
              testing::internal::AssertHelper::~AssertHelper(&local_1c0);
              std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
              testing::Message::~Message(&local_1b8);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a8);
            if (bVar1) {
              TestBody::anon_class_8_1_898f2789::operator()
                        ((anon_class_8_1_898f2789 *)&gtest_ar__1.message_,
                         "CN=Name,O=Org2+CN=Name2+OU=Unit,O=Org");
              pXVar2 = std::unique_ptr<X509_name_st,_bssl::internal::Deleter>::get
                                 ((unique_ptr<X509_name_st,_bssl::internal::Deleter> *)
                                  &gtest_ar_.message_);
              pcVar3 = (char *)0x0;
              local_1f4 = X509_NAME_add_entry_by_NID((X509_NAME *)pXVar2,0xe,0x1000,"US",-1,0,-1);
              testing::AssertionResult::AssertionResult<int>
                        ((AssertionResult *)local_1f0,&local_1f4,(type *)0x0);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f0);
              if (!bVar1) {
                testing::Message::Message(&local_200);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar__7.message_,(internal *)local_1f0,
                           (AssertionResult *)
                           "X509_NAME_add_entry_by_NID( name.get(), 14, (0x1000), reinterpret_cast<const unsigned char *>(\"US\"), -1, 0, -1)"
                           ,"false","true",pcVar3);
                pcVar3 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_208,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                           ,0x167c,pcVar3);
                testing::internal::AssertHelper::operator=(&local_208,&local_200);
                testing::internal::AssertHelper::~AssertHelper(&local_208);
                std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
                testing::Message::~Message(&local_200);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f0);
              if (bVar1) {
                TestBody::anon_class_8_1_898f2789::operator()
                          ((anon_class_8_1_898f2789 *)&gtest_ar__1.message_,
                           "CN=Name,O=Org2+CN=Name2+OU=Unit,O=Org,C=US");
                pXVar2 = std::unique_ptr<X509_name_st,_bssl::internal::Deleter>::get
                                   ((unique_ptr<X509_name_st,_bssl::internal::Deleter> *)
                                    &gtest_ar_.message_);
                pcVar3 = (char *)0xffffffff;
                local_23c = X509_NAME_add_entry_by_NID
                                      ((X509_NAME *)pXVar2,0xd,0x1000,(uchar *)"Name3",-1,-1,1);
                testing::AssertionResult::AssertionResult<int>
                          ((AssertionResult *)local_238,&local_23c,(type *)0x0);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_238);
                if (!bVar1) {
                  testing::Message::Message(&local_248);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)&gtest_ar__8.message_,(internal *)local_238,
                             (AssertionResult *)
                             "X509_NAME_add_entry_by_NID( name.get(), 13, (0x1000), reinterpret_cast<const unsigned char *>(\"Name3\"), -1, -1, 1)"
                             ,"false","true",pcVar3);
                  pcVar3 = (char *)std::__cxx11::string::c_str();
                  testing::internal::AssertHelper::AssertHelper
                            (&local_250,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                             ,0x1683,pcVar3);
                  testing::internal::AssertHelper::operator=(&local_250,&local_248);
                  testing::internal::AssertHelper::~AssertHelper(&local_250);
                  std::__cxx11::string::~string((string *)&gtest_ar__8.message_);
                  testing::Message::~Message(&local_248);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_238);
                if (bVar1) {
                  TestBody::anon_class_8_1_898f2789::operator()
                            ((anon_class_8_1_898f2789 *)&gtest_ar__1.message_,
                             "CN=Name3,CN=Name,O=Org2+CN=Name2+OU=Unit,O=Org,C=US");
                  pXVar2 = std::unique_ptr<X509_name_st,_bssl::internal::Deleter>::get
                                     ((unique_ptr<X509_name_st,_bssl::internal::Deleter> *)
                                      &gtest_ar_.message_);
                  pcVar3 = (char *)0x3;
                  local_284 = X509_NAME_add_entry_by_NID
                                        ((X509_NAME *)pXVar2,0xd,0x1000,(uchar *)"Name4",-1,3,0);
                  testing::AssertionResult::AssertionResult<int>
                            ((AssertionResult *)local_280,&local_284,(type *)0x0);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_280);
                  if (!bVar1) {
                    testing::Message::Message(&local_290);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              (&local_2b8,(internal *)local_280,
                               (AssertionResult *)
                               "X509_NAME_add_entry_by_NID( name.get(), 13, (0x1000), reinterpret_cast<const unsigned char *>(\"Name4\"), -1, 3, 0)"
                               ,"false","true",pcVar3);
                    pcVar3 = (char *)std::__cxx11::string::c_str();
                    testing::internal::AssertHelper::AssertHelper
                              (&local_298,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                               ,0x168c,pcVar3);
                    testing::internal::AssertHelper::operator=(&local_298,&local_290);
                    testing::internal::AssertHelper::~AssertHelper(&local_298);
                    std::__cxx11::string::~string((string *)&local_2b8);
                    testing::Message::~Message(&local_290);
                  }
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_280);
                  if (bVar1) {
                    TestBody::anon_class_8_1_898f2789::operator()
                              ((anon_class_8_1_898f2789 *)&gtest_ar__1.message_,
                               "CN=Name3,CN=Name,O=Org2+CN=Name2,CN=Name4+OU=Unit,O=Org,C=US");
                    pXVar2 = std::unique_ptr<X509_name_st,_bssl::internal::Deleter>::get
                                       ((unique_ptr<X509_name_st,_bssl::internal::Deleter> *)
                                        &gtest_ar_.message_);
                    pXVar4 = X509_NAME_delete_entry((X509_NAME *)pXVar2,7);
                    X509_NAME_ENTRY_free(pXVar4);
                    TestBody::anon_class_8_1_898f2789::operator()
                              ((anon_class_8_1_898f2789 *)&gtest_ar__1.message_,
                               "CN=Name,O=Org2+CN=Name2,CN=Name4+OU=Unit,O=Org,C=US");
                    pXVar2 = std::unique_ptr<X509_name_st,_bssl::internal::Deleter>::get
                                       ((unique_ptr<X509_name_st,_bssl::internal::Deleter> *)
                                        &gtest_ar_.message_);
                    pXVar4 = X509_NAME_delete_entry((X509_NAME *)pXVar2,0);
                    X509_NAME_ENTRY_free(pXVar4);
                    TestBody::anon_class_8_1_898f2789::operator()
                              ((anon_class_8_1_898f2789 *)&gtest_ar__1.message_,
                               "CN=Name,O=Org2+CN=Name2,CN=Name4+OU=Unit,O=Org");
                    pXVar2 = std::unique_ptr<X509_name_st,_bssl::internal::Deleter>::get
                                       ((unique_ptr<X509_name_st,_bssl::internal::Deleter> *)
                                        &gtest_ar_.message_);
                    pXVar4 = X509_NAME_delete_entry((X509_NAME *)pXVar2,1);
                    X509_NAME_ENTRY_free(pXVar4);
                    TestBody::anon_class_8_1_898f2789::operator()
                              ((anon_class_8_1_898f2789 *)&gtest_ar__1.message_,
                               "CN=Name,O=Org2+CN=Name2,CN=Name4,O=Org");
                    pXVar2 = std::unique_ptr<X509_name_st,_bssl::internal::Deleter>::get
                                       ((unique_ptr<X509_name_st,_bssl::internal::Deleter> *)
                                        &gtest_ar_.message_);
                    pXVar4 = X509_NAME_delete_entry((X509_NAME *)pXVar2,1);
                    X509_NAME_ENTRY_free(pXVar4);
                    TestBody::anon_class_8_1_898f2789::operator()
                              ((anon_class_8_1_898f2789 *)&gtest_ar__1.message_,
                               "CN=Name,O=Org2+CN=Name2,O=Org");
                    pXVar2 = std::unique_ptr<X509_name_st,_bssl::internal::Deleter>::get
                                       ((unique_ptr<X509_name_st,_bssl::internal::Deleter> *)
                                        &gtest_ar_.message_);
                    pXVar4 = X509_NAME_delete_entry((X509_NAME *)pXVar2,2);
                    X509_NAME_ENTRY_free(pXVar4);
                    TestBody::anon_class_8_1_898f2789::operator()
                              ((anon_class_8_1_898f2789 *)&gtest_ar__1.message_,
                               "CN=Name,CN=Name2,O=Org");
                    pXVar2 = std::unique_ptr<X509_name_st,_bssl::internal::Deleter>::get
                                       ((unique_ptr<X509_name_st,_bssl::internal::Deleter> *)
                                        &gtest_ar_.message_);
                    pXVar4 = X509_NAME_delete_entry((X509_NAME *)pXVar2,1);
                    X509_NAME_ENTRY_free(pXVar4);
                    TestBody::anon_class_8_1_898f2789::operator()
                              ((anon_class_8_1_898f2789 *)&gtest_ar__1.message_,"CN=Name,O=Org");
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  std::unique_ptr<X509_name_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<X509_name_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST(X509Test, NameEntry) {
  bssl::UniquePtr<X509_NAME> name(X509_NAME_new());
  ASSERT_TRUE(name);

  auto check_name = [&](const char *expected_rfc2253) {
    // Check RDN indices are self-consistent.
    int num = X509_NAME_entry_count(name.get());
    if (num > 0) {
      // RDN indices must start at zero.
      EXPECT_EQ(0, X509_NAME_ENTRY_set(X509_NAME_get_entry(name.get(), 0)));
    }
    for (int i = 1; i < num; i++) {
      int prev = X509_NAME_ENTRY_set(X509_NAME_get_entry(name.get(), i - 1));
      int current = X509_NAME_ENTRY_set(X509_NAME_get_entry(name.get(), i));
      // RDN indices must increase consecutively.
      EXPECT_TRUE(prev == current || prev + 1 == current)
          << "Entry " << i << " has RDN index " << current
          << " which is inconsistent with previous index " << prev;
    }

    // Check the name based on the RFC 2253 serialization. Note the RFC 2253
    // serialization is in reverse.
    bssl::UniquePtr<BIO> bio(BIO_new(BIO_s_mem()));
    ASSERT_TRUE(bio);
    EXPECT_GE(X509_NAME_print_ex(bio.get(), name.get(), 0, XN_FLAG_RFC2253), 0);
    const uint8_t *data;
    size_t len;
    ASSERT_TRUE(BIO_mem_contents(bio.get(), &data, &len));
    EXPECT_EQ(expected_rfc2253, std::string(data, data + len));
  };

  check_name("");

  // |loc| = -1, |set| = 0 appends as new RDNs.
  ASSERT_TRUE(X509_NAME_add_entry_by_NID(
      name.get(), NID_organizationName, MBSTRING_UTF8,
      reinterpret_cast<const unsigned char *>("Org"), /*len=*/-1, /*loc=*/-1,
      /*set=*/0));
  check_name("O=Org");

  // |loc| = -1, |set| = 0 appends as new RDNs.
  ASSERT_TRUE(X509_NAME_add_entry_by_NID(
      name.get(), NID_commonName, MBSTRING_UTF8,
      reinterpret_cast<const unsigned char *>("Name"), /*len=*/-1, /*loc=*/-1,
      /*set=*/0));
  check_name("CN=Name,O=Org");

  // Inserting in the middle of the set, but with |set| = 0 inserts a new RDN
  // and fixes the "set" values as needed.
  ASSERT_TRUE(X509_NAME_add_entry_by_NID(
      name.get(), NID_organizationalUnitName, MBSTRING_UTF8,
      reinterpret_cast<const unsigned char *>("Unit"), /*len=*/-1, /*loc=*/1,
      /*set=*/0));
  check_name("CN=Name,OU=Unit,O=Org");

  // |set = -1| adds to the previous entry's RDN. (Although putting O and OU at
  // the same level makes little sense, the test is written this way to check
  // the function isn't using attribute types to order things.)
  ASSERT_TRUE(X509_NAME_add_entry_by_NID(
      name.get(), NID_organizationName, MBSTRING_UTF8,
      reinterpret_cast<const unsigned char *>("Org2"), /*len=*/-1, /*loc=*/2,
      /*set=*/-1));
  check_name("CN=Name,O=Org2+OU=Unit,O=Org");

  // |set| = 1 adds to the next entry's RDN.
  ASSERT_TRUE(X509_NAME_add_entry_by_NID(
      name.get(), NID_commonName, MBSTRING_UTF8,
      reinterpret_cast<const unsigned char *>("Name2"), /*len=*/-1, /*loc=*/2,
      /*set=*/-1));
  check_name("CN=Name,O=Org2+CN=Name2+OU=Unit,O=Org");

  // If there is no previous RDN, |set| = -1 makes a new RDN.
  ASSERT_TRUE(X509_NAME_add_entry_by_NID(
      name.get(), NID_countryName, MBSTRING_UTF8,
      reinterpret_cast<const unsigned char *>("US"), /*len=*/-1, /*loc=*/0,
      /*set=*/-1));
  check_name("CN=Name,O=Org2+CN=Name2+OU=Unit,O=Org,C=US");

  // Likewise if there is no next RDN.
  ASSERT_TRUE(X509_NAME_add_entry_by_NID(
      name.get(), NID_commonName, MBSTRING_UTF8,
      reinterpret_cast<const unsigned char *>("Name3"), /*len=*/-1, /*loc=*/-1,
      /*set=*/1));
  check_name("CN=Name3,CN=Name,O=Org2+CN=Name2+OU=Unit,O=Org,C=US");

  // If |set| = 0 and we insert in the middle of an existing RDN, it adds an
  // RDN boundary after the entry but not before. This is a quirk of how the
  // function is implemented and hopefully not something any caller depends on.
  ASSERT_TRUE(X509_NAME_add_entry_by_NID(
      name.get(), NID_commonName, MBSTRING_UTF8,
      reinterpret_cast<const unsigned char *>("Name4"), /*len=*/-1, /*loc=*/3,
      /*set=*/0));
  check_name("CN=Name3,CN=Name,O=Org2+CN=Name2,CN=Name4+OU=Unit,O=Org,C=US");

  // Entries may be deleted.
  X509_NAME_ENTRY_free(X509_NAME_delete_entry(name.get(), 7));
  check_name("CN=Name,O=Org2+CN=Name2,CN=Name4+OU=Unit,O=Org,C=US");

  // When deleting the only attribute in an RDN, index invariants should still
  // hold.
  X509_NAME_ENTRY_free(X509_NAME_delete_entry(name.get(), 0));
  check_name("CN=Name,O=Org2+CN=Name2,CN=Name4+OU=Unit,O=Org");

  // Index invariants also hold when deleting attributes from non-singular RDNs.
  X509_NAME_ENTRY_free(X509_NAME_delete_entry(name.get(), 1));
  check_name("CN=Name,O=Org2+CN=Name2,CN=Name4,O=Org");
  X509_NAME_ENTRY_free(X509_NAME_delete_entry(name.get(), 1));
  check_name("CN=Name,O=Org2+CN=Name2,O=Org");

  // Same as above, but delete the second attribute first.
  X509_NAME_ENTRY_free(X509_NAME_delete_entry(name.get(), 2));
  check_name("CN=Name,CN=Name2,O=Org");
  X509_NAME_ENTRY_free(X509_NAME_delete_entry(name.get(), 1));
  check_name("CN=Name,O=Org");
}